

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void boost::detail::sp_pointer_construct<PartialPolicyPoolItemInterface,PartialJPDPValuePair>
               (shared_ptr<PartialPolicyPoolItemInterface> *ppx,PartialJPDPValuePair *p,
               shared_count *pn)

{
  shared_count *in_RDX;
  undefined8 in_RSI;
  PartialJPDPValuePair *in_RDI;
  shared_count *unaff_retaddr;
  shared_count in_stack_ffffffffffffffe0;
  
  shared_count::shared_count<PartialJPDPValuePair>(unaff_retaddr,in_RDI);
  shared_count::swap((shared_count *)&stack0xffffffffffffffe0,in_RDX);
  shared_count::~shared_count((shared_count *)in_stack_ffffffffffffffe0.pi_);
  sp_enable_shared_from_this(in_RDI,in_RSI,in_RSI);
  return;
}

Assistant:

inline void sp_pointer_construct( boost::shared_ptr< T > * ppx, Y * p, boost::detail::shared_count & pn )
{
    boost::detail::shared_count( p ).swap( pn );
    boost::detail::sp_enable_shared_from_this( ppx, p, p );
}